

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O1

int libtorrent::ed25519_verify
              (uchar *signature,uchar *message,ptrdiff_t message_len,uchar *public_key)

{
  int iVar1;
  uint uVar2;
  span<const_char> data;
  span<const_char> data_00;
  span<const_char> data_01;
  uchar checker [32];
  sha512_hash h;
  hasher512 hash;
  ge_p2 R;
  ge_p3 A;
  uchar local_288;
  uchar local_287;
  uchar local_286;
  uchar local_285;
  uchar local_284;
  uchar local_283;
  uchar local_282;
  uchar local_281;
  uchar local_280;
  uchar local_27f;
  uchar local_27e;
  uchar local_27d;
  uchar local_27c;
  uchar local_27b;
  uchar local_27a;
  uchar local_279;
  uchar local_278;
  uchar local_277;
  uchar local_276;
  uchar local_275;
  uchar local_274;
  uchar local_273;
  uchar local_272;
  uchar local_271;
  uchar local_270;
  uchar local_26f;
  uchar local_26e;
  uchar local_26d;
  uchar local_26c;
  uchar local_26b;
  uchar local_26a;
  uchar local_269;
  sha512_hash local_260;
  hasher512 local_220;
  ge_p2 local_148;
  ge_p3 local_d0;
  
  uVar2 = 0;
  if (signature[0x3f] < 0x20) {
    iVar1 = ge_frombytes_negate_vartime(&local_d0,public_key);
    if (iVar1 == 0) {
      hasher512::hasher512(&local_220);
      data.m_len = 0x20;
      data.m_ptr = (char *)signature;
      hasher512::update(&local_220,data);
      data_00.m_len = 0x20;
      data_00.m_ptr = (char *)public_key;
      hasher512::update(&local_220,data_00);
      data_01.m_len = message_len;
      data_01.m_ptr = (char *)message;
      hasher512::update(&local_220,data_01);
      hasher512::final(&local_260,&local_220);
      sc_reduce((uchar *)&local_260);
      ge_double_scalarmult_vartime(&local_148,(uchar *)&local_260,&local_d0,signature + 0x20);
      ge_tobytes(&local_288,&local_148);
      uVar2 = (uint)(local_269 == signature[0x1f] &&
                    ((local_26a == signature[0x1e] && local_26b == signature[0x1d]) &&
                    ((local_26c == signature[0x1c] &&
                     (local_26d == signature[0x1b] &&
                     (local_26e == signature[0x1a] &&
                     (local_26f == signature[0x19] &&
                     (local_270 == signature[0x18] &&
                     (local_271 == signature[0x17] && local_272 == signature[0x16])))))) &&
                    ((local_273 == signature[0x15] &&
                     (local_274 == signature[0x14] &&
                     (local_275 == signature[0x13] &&
                     (local_276 == signature[0x12] &&
                     (local_277 == signature[0x11] && local_278 == signature[0x10]))))) &&
                    ((local_279 == signature[0xf] &&
                     (local_27a == signature[0xe] &&
                     (local_27b == signature[0xd] &&
                     (local_27c == signature[0xc] && local_27d == signature[0xb])))) &&
                    ((local_27e == signature[10] &&
                     (local_27f == signature[9] &&
                     (local_280 == signature[8] && local_281 == signature[7]))) &&
                    ((local_282 == signature[6] &&
                     (local_283 == signature[5] && local_284 == signature[4])) &&
                    ((local_285 == signature[3] && local_286 == signature[2]) &&
                    (local_287 == signature[1] && local_288 == *signature)))))))));
      hasher512::~hasher512(&local_220);
    }
  }
  return uVar2;
}

Assistant:

int ed25519_verify(const unsigned char *signature, const unsigned char *message, std::ptrdiff_t message_len, const unsigned char *public_key) {
    unsigned char checker[32];
    ge_p3 A;
    ge_p2 R;

    if (signature[63] & 224) {
        return 0;
    }

    if (ge_frombytes_negate_vartime(&A, public_key) != 0) {
        return 0;
    }

    hasher512 hash;
    hash.update({reinterpret_cast<char const*>(signature), 32});
    hash.update({reinterpret_cast<char const*>(public_key), 32});
    hash.update({reinterpret_cast<char const*>(message), message_len});
    sha512_hash h = hash.final();
    
    sc_reduce(reinterpret_cast<unsigned char*>(h.data()));
    ge_double_scalarmult_vartime(&R, reinterpret_cast<unsigned char*>(h.data())
        , &A, signature + 32);
    ge_tobytes(checker, &R);

    if (!consttime_equal(checker, signature)) {
        return 0;
    }

    return 1;
}